

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# headerssync.cpp
# Opt level: O2

bool __thiscall
HeadersSyncState::ValidateAndStoreRedownloadedHeader(HeadersSyncState *this,CBlockHeader *header)

{
  uint256 *b;
  ulong uVar1;
  undefined1 auVar2 [16];
  bool bVar3;
  _Elt_pointer pCVar4;
  uint32_t *puVar5;
  size_type sVar6;
  size_t sVar7;
  ulong uVar8;
  Level LVar9;
  uint256 *puVar10;
  arith_uint256 *b_00;
  uint256 *a;
  Params *params;
  bitdeque<32768> *category;
  bitdeque<32768> *this_00;
  int source_line;
  char *fmt;
  long height;
  long in_FS_OFFSET;
  string_view logging_function;
  string_view source_file;
  int64_t next_height;
  CBlockIndex local_f0;
  base_uint<256U> local_58;
  long local_38;
  CBlockIndex *__return_storage_ptr__;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (this->m_download_state == REDOWNLOAD) {
    height = this->m_redownload_buffer_last_height + 1;
    a = &header->hashPrevBlock;
    b = &this->m_redownload_buffer_last_hash;
    puVar10 = b;
    next_height = height;
    bVar3 = operator!=(&a->super_base_blob<256U>,&b->super_base_blob<256U>);
    if (bVar3) {
      bVar3 = ::LogAcceptCategory((LogFlags)a,(Level)puVar10);
      if (bVar3) {
        fmt = 
        "Initial headers sync aborted with peer=%d: non-continuous headers at height=%i (redownload phase)\n"
        ;
        source_line = 0xe2;
LAB_003b818a:
        logging_function._M_str = "ValidateAndStoreRedownloadedHeader";
        logging_function._M_len = 0x22;
        source_file._M_str =
             "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/headerssync.cpp"
        ;
        source_file._M_len = 0x5f;
        LogPrintFormatInternal<long,long>
                  (logging_function,source_file,source_line,NET,Debug,(ConstevalFormatString<2U>)fmt
                   ,&this->m_id,&next_height);
      }
    }
    else {
      pCVar4 = (this->m_redownloaded_headers).
               super__Deque_base<CompressedHeader,_std::allocator<CompressedHeader>_>._M_impl.
               super__Deque_impl_data._M_finish._M_cur;
      if (pCVar4 == (this->m_redownloaded_headers).
                    super__Deque_base<CompressedHeader,_std::allocator<CompressedHeader>_>._M_impl.
                    super__Deque_impl_data._M_start._M_cur) {
        puVar5 = &this->m_chain_start->nBits;
      }
      else {
        if (pCVar4 == (this->m_redownloaded_headers).
                      super__Deque_base<CompressedHeader,_std::allocator<CompressedHeader>_>._M_impl
                      .super__Deque_impl_data._M_finish._M_first) {
          pCVar4 = (this->m_redownloaded_headers).
                   super__Deque_base<CompressedHeader,_std::allocator<CompressedHeader>_>._M_impl.
                   super__Deque_impl_data._M_finish._M_node[-1] + 10;
        }
        puVar5 = &pCVar4[-1].nBits;
      }
      params = this->m_consensus_params;
      bVar3 = PermittedDifficultyTransition(params,height,*puVar5,header->nBits);
      if (bVar3) {
        CBlockIndex::CBlockIndex(&local_f0,header);
        GetBlockProof((arith_uint256 *)&local_58,&local_f0);
        base_uint<256U>::operator+=
                  (&(this->m_redownload_chain_work).super_base_uint<256U>,&local_58);
        b_00 = &this->m_minimum_required_work;
        bVar3 = operator>=(&(this->m_redownload_chain_work).super_base_uint<256U>,
                           &b_00->super_base_uint<256U>);
        LVar9 = (Level)b_00;
        if (bVar3) {
          this->m_process_all_remaining_headers = true;
        }
        else if (((this->m_process_all_remaining_headers & 1U) == 0) &&
                (auVar2._8_8_ = 0, auVar2._0_8_ = next_height,
                SUB164(auVar2 % ZEXT816(0x267),0) == this->m_commit_offset)) {
          this_00 = &this->m_header_commitments;
          category = this_00;
          sVar6 = bitdeque<32768>::size(this_00);
          if (sVar6 == 0) {
            bVar3 = ::LogAcceptCategory((LogFlags)category,LVar9);
            if (bVar3) {
              fmt = 
              "Initial headers sync aborted with peer=%d: commitment overrun at height=%i (redownload phase)\n"
              ;
              source_line = 0x103;
              goto LAB_003b818a;
            }
          }
          else {
            __return_storage_ptr__ = &local_f0;
            CBlockHeader::GetHash((uint256 *)__return_storage_ptr__,header);
            sVar7 = SaltedTxidHasher::operator()(&this->m_hasher,(uint256 *)__return_storage_ptr__);
            LVar9 = (Level)__return_storage_ptr__;
            uVar8 = (ulong)(this->m_header_commitments).m_pad_begin;
            uVar1 = (((this->m_header_commitments).m_deque.
                      super__Deque_base<std::bitset<32768UL>,_std::allocator<std::bitset<32768UL>_>_>
                      ._M_impl.super__Deque_impl_data._M_start._M_cur)->super__Base_bitset<512UL>).
                    _M_w[uVar8 >> 6];
            bitdeque<32768>::pop_front(this_00);
            if (((uVar1 >> (uVar8 & 0x3f) & 1) != 0) == (bool)((byte)sVar7 & 1)) goto LAB_003b828e;
            bVar3 = ::LogAcceptCategory((LogFlags)this_00,LVar9);
            if (bVar3) {
              fmt = 
              "Initial headers sync aborted with peer=%d: commitment mismatch at height=%i (redownload phase)\n"
              ;
              source_line = 0x10c;
              goto LAB_003b818a;
            }
          }
          goto LAB_003b8199;
        }
LAB_003b828e:
        std::deque<CompressedHeader,std::allocator<CompressedHeader>>::
        emplace_back<CBlockHeader_const&>
                  ((deque<CompressedHeader,std::allocator<CompressedHeader>> *)
                   &this->m_redownloaded_headers,header);
        this->m_redownload_buffer_last_height = next_height;
        CBlockHeader::GetHash((uint256 *)&local_f0,header);
        *(CBlockIndex **)
         ((this->m_redownload_buffer_last_hash).super_base_blob<256U>.m_data._M_elems + 0x10) =
             local_f0.pskip;
        *(undefined8 *)
         ((this->m_redownload_buffer_last_hash).super_base_blob<256U>.m_data._M_elems + 0x18) =
             local_f0._24_8_;
        *(uint256 **)(b->super_base_blob<256U>).m_data._M_elems = local_f0.phashBlock;
        *(CBlockIndex **)
         ((this->m_redownload_buffer_last_hash).super_base_blob<256U>.m_data._M_elems + 8) =
             local_f0.pprev;
        bVar3 = true;
        goto LAB_003b819b;
      }
      bVar3 = ::LogAcceptCategory((LogFlags)params,(Level)height);
      if (bVar3) {
        fmt = 
        "Initial headers sync aborted with peer=%d: invalid difficulty transition at height=%i (redownload phase)\n"
        ;
        source_line = 0xf0;
        goto LAB_003b818a;
      }
    }
  }
LAB_003b8199:
  bVar3 = false;
LAB_003b819b:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return bVar3;
  }
  __stack_chk_fail();
}

Assistant:

bool HeadersSyncState::ValidateAndStoreRedownloadedHeader(const CBlockHeader& header)
{
    Assume(m_download_state == State::REDOWNLOAD);
    if (m_download_state != State::REDOWNLOAD) return false;

    int64_t next_height = m_redownload_buffer_last_height + 1;

    // Ensure that we're working on a header that connects to the chain we're
    // downloading.
    if (header.hashPrevBlock != m_redownload_buffer_last_hash) {
        LogDebug(BCLog::NET, "Initial headers sync aborted with peer=%d: non-continuous headers at height=%i (redownload phase)\n", m_id, next_height);
        return false;
    }

    // Check that the difficulty adjustments are within our tolerance:
    uint32_t previous_nBits{0};
    if (!m_redownloaded_headers.empty()) {
        previous_nBits = m_redownloaded_headers.back().nBits;
    } else {
        previous_nBits = m_chain_start->nBits;
    }

    if (!PermittedDifficultyTransition(m_consensus_params, next_height,
                previous_nBits, header.nBits)) {
        LogDebug(BCLog::NET, "Initial headers sync aborted with peer=%d: invalid difficulty transition at height=%i (redownload phase)\n", m_id, next_height);
        return false;
    }

    // Track work on the redownloaded chain
    m_redownload_chain_work += GetBlockProof(CBlockIndex(header));

    if (m_redownload_chain_work >= m_minimum_required_work) {
        m_process_all_remaining_headers = true;
    }

    // If we're at a header for which we previously stored a commitment, verify
    // it is correct. Failure will result in aborting download.
    // Also, don't check commitments once we've gotten to our target blockhash;
    // it's possible our peer has extended its chain between our first sync and
    // our second, and we don't want to return failure after we've seen our
    // target blockhash just because we ran out of commitments.
    if (!m_process_all_remaining_headers && next_height % HEADER_COMMITMENT_PERIOD == m_commit_offset) {
        if (m_header_commitments.size() == 0) {
            LogDebug(BCLog::NET, "Initial headers sync aborted with peer=%d: commitment overrun at height=%i (redownload phase)\n", m_id, next_height);
            // Somehow our peer managed to feed us a different chain and
            // we've run out of commitments.
            return false;
        }
        bool commitment = m_hasher(header.GetHash()) & 1;
        bool expected_commitment = m_header_commitments.front();
        m_header_commitments.pop_front();
        if (commitment != expected_commitment) {
            LogDebug(BCLog::NET, "Initial headers sync aborted with peer=%d: commitment mismatch at height=%i (redownload phase)\n", m_id, next_height);
            return false;
        }
    }

    // Store this header for later processing.
    m_redownloaded_headers.emplace_back(header);
    m_redownload_buffer_last_height = next_height;
    m_redownload_buffer_last_hash = header.GetHash();

    return true;
}